

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createStore(Builder *this,Id rValue,Id lValue)

{
  Block *this_00;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38 [3];
  Instruction *local_20;
  Instruction *store;
  Id lValue_local;
  Id rValue_local;
  Builder *this_local;
  
  store._0_4_ = lValue;
  store._4_4_ = rValue;
  _lValue_local = this;
  this_01 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,rValue));
  Instruction::Instruction(this_01,OpStore);
  local_20 = this_01;
  Instruction::addIdOperand(this_01,(Id)store);
  Instruction::addIdOperand(local_20,store._4_4_);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_38,local_20
            );
  Block::addInstruction(this_00,local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_38);
  return;
}

Assistant:

void Builder::createStore(Id rValue, Id lValue)
{
    Instruction* store = new Instruction(OpStore);
    store->addIdOperand(lValue);
    store->addIdOperand(rValue);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(store));
}